

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O3

int amqp_put_back_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  int iVar1;
  amqp_link_t *paVar2;
  
  paVar2 = amqp_create_link_for_frame(state,frame);
  if (paVar2 == (amqp_link_t *)0x0) {
    iVar1 = -1;
  }
  else {
    if (state->first_queued_frame == (amqp_link_t_ *)0x0) {
      state->first_queued_frame = paVar2;
      state->last_queued_frame = paVar2;
      paVar2->next = (amqp_link_t_ *)0x0;
    }
    else {
      paVar2->next = state->first_queued_frame;
      state->first_queued_frame = paVar2;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int amqp_put_back_frame(amqp_connection_state_t state, amqp_frame_t *frame) {
  amqp_link_t *link = amqp_create_link_for_frame(state, frame);
  if (NULL == link) {
    return AMQP_STATUS_NO_MEMORY;
  }

  if (NULL == state->first_queued_frame) {
    state->first_queued_frame = link;
    state->last_queued_frame = link;
    link->next = NULL;
  } else {
    link->next = state->first_queued_frame;
    state->first_queued_frame = link;
  }

  return AMQP_STATUS_OK;
}